

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

bool __thiscall GlobOpt::CollectMemOpStElementI(GlobOpt *this,Instr *instr,Loop *loop)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  undefined4 *puVar5;
  Opnd *pOVar6;
  bool local_2e;
  Loop *loop_local;
  Instr *instr_local;
  GlobOpt *this_local;
  
  if ((instr->m_opcode != StElemI_A) && (instr->m_opcode != StElemI_A_Strict)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x864,
                       "(instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict)"
                       ,
                       "instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pOVar6 = IR::Instr::GetSrc1(instr);
  if (pOVar6 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x865,"(instr->GetSrc1())","instr->GetSrc1()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  uVar3 = Func::GetSourceContextId(this->func);
  uVar4 = Func::GetLocalFunctionId(this->func);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,MemSetPhase,uVar3,uVar4);
  if ((!bVar2) && (bVar2 = CollectMemsetStElementI(this,instr,loop), bVar2)) {
    return true;
  }
  uVar3 = Func::GetSourceContextId(this->func);
  uVar4 = Func::GetLocalFunctionId(this->func);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,MemCopyPhase,uVar3,uVar4);
  local_2e = false;
  if (!bVar2) {
    local_2e = CollectMemcopyStElementI(this,instr,loop);
  }
  return local_2e;
}

Assistant:

bool
GlobOpt::CollectMemOpStElementI(IR::Instr *instr, Loop *loop)
{
    Assert(instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict);
    Assert(instr->GetSrc1());
    return (!PHASE_OFF(Js::MemSetPhase, this->func) && CollectMemsetStElementI(instr, loop)) ||
        (!PHASE_OFF(Js::MemCopyPhase, this->func) && CollectMemcopyStElementI(instr, loop));
}